

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<16,_5,_5>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  Type in1;
  Type in0;
  Vector<float,_3> local_4c;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  VecAccess<float,_4,_3> local_30;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,5>((ShaderEvalContext *)&in0,(int)evalCtx);
  }
  else {
    tcu::Matrix<float,_2,_2>::Matrix(&in0,(float *)s_constInMat2x2);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,5>((ShaderEvalContext *)&in1,(int)evalCtx);
  }
  else {
    tcu::Matrix<float,_2,_2>::Matrix(&in1,(float *)(s_constInMat2x2 + 0x10));
  }
  tcu::operator-((tcu *)&local_40,&in0,&in1);
  local_4c.m_data[2] = local_3c + local_34;
  local_4c.m_data[0] = local_40;
  local_4c.m_data[1] = local_38;
  local_30.m_vector = &evalCtx->color;
  local_30.m_index[0] = 0;
  local_30.m_index[1] = 1;
  local_30.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_30,&local_4c);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 - in1);
	}